

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O2

void __thiscall CChat::OnReset(CChat *this)

{
  CCommandManager *this_00;
  char *pcVar1;
  uint uVar2;
  bool *pbVar3;
  int i;
  long lVar4;
  ulong uVar5;
  CGameClient *pCVar6;
  ulong uVar7;
  
  pCVar6 = (this->super_CComponent).m_pClient;
  if ((pCVar6->m_pClient->m_State & 0xfffffffbU) == 0) {
    for (lVar4 = 0x311; lVar4 != 0x25ca1; lVar4 = lVar4 + 0x268) {
      pcVar1 = this->m_aInputBuf + lVar4 + -0x71;
      pcVar1[0] = '\0';
      pcVar1[1] = '\0';
      pcVar1[2] = '\0';
      pcVar1[3] = '\0';
      pcVar1[4] = '\0';
      pcVar1[5] = '\0';
      pcVar1[6] = '\0';
      pcVar1[7] = '\0';
      pcVar1 = this->m_aInputBuf + lVar4 + -0x65;
      pcVar1[0] = '\0';
      pcVar1[1] = '\0';
      pcVar1[2] = -0x80;
      pcVar1[3] = -0x41;
      this->m_aInputBuf[lVar4 + -0x10] = '\0';
      this->m_aInputBuf[lVar4 + -0x51] = '\0';
    }
    Disable(this);
    this->m_LastWhisperFrom = -1;
    uVar7 = 0;
    this->m_Show = false;
    this->m_BacklogPage = 0;
    this->m_CompletionChosen = -1;
    this->m_CompletionFav = -1;
    this->m_aCompletionBuffer[0] = '\0';
    this->m_PlaceholderOffset = 0;
    this->m_PlaceholderLength = 0;
    this->m_pHistoryEntry = (CHistoryEntry *)0x0;
    this->m_PendingChatCounter = 0;
    this->m_LastChatSend = 0;
    this->m_IgnoreCommand = false;
    this->m_SelectedCommand = 0;
    this->m_CommandStart = 0;
    array<bool,_allocator_default<bool>_>::set_size(&this->m_aFilter,8);
    uVar2 = (this->m_aFilter).num_elements;
    pbVar3 = (this->m_aFilter).list;
    uVar5 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar5 = uVar7;
    }
    for (; uVar5 != uVar7; uVar7 = uVar7 + 1) {
      pbVar3[uVar7] = false;
    }
    this->m_FilteredCount = 0;
    for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
      this->m_aLastSoundPlayed[lVar4] = 0;
    }
    pCVar6 = (this->super_CComponent).m_pClient;
  }
  else {
    for (lVar4 = 700; lVar4 != 0x25c4c; lVar4 = lVar4 + 0x268) {
      pcVar1 = this->m_aInputBuf + lVar4 + -0x10;
      pcVar1[0] = '\0';
      pcVar1[1] = '\0';
      pcVar1[2] = -0x80;
      pcVar1[3] = -0x41;
    }
  }
  this->m_CurrentLineWidth = -1.0;
  if (pCVar6->m_pClient->m_State < 3) {
    this_00 = &this->m_CommandManager;
    array<CCommandManager::CCommand,_allocator_default<CCommandManager::CCommand>_>::clear
              (&this_00->m_aCommands);
    CCommandManager::AddCommand(this_00,"all","Switch to all chat","?r[message]",Com_All,this);
    CCommandManager::AddCommand(this_00,"friend","Add player as friend","s[name]",Com_Befriend,this)
    ;
    CCommandManager::AddCommand(this_00,"m","Mute a player","s[name]",Com_Mute,this);
    CCommandManager::AddCommand(this_00,"mute","Mute a player","s[name]",Com_Mute,this);
    CCommandManager::AddCommand(this_00,"r","Reply to a whisper","?r[message]",Com_Reply,this);
    CCommandManager::AddCommand(this_00,"team","Switch to team chat","?r[message]",Com_Team,this);
    CCommandManager::AddCommand(this_00,"w","Whisper another player","r[name]",Com_Whisper,this);
    CCommandManager::AddCommand
              (this_00,"whisper","Whisper another player","r[name]",Com_Whisper,this);
    return;
  }
  return;
}

Assistant:

void CChat::OnReset()
{
	if(Client()->State() == IClient::STATE_OFFLINE || Client()->State() == IClient::STATE_DEMOPLAYBACK)
	{
		for(int i = 0; i < MAX_LINES; i++)
		{
			m_aLines[i].m_Time = 0;
			m_aLines[i].m_Size.y = -1.0f;
			m_aLines[i].m_aText[0] = '\0';
			m_aLines[i].m_aName[0] = '\0';
		}

		Disable();
		m_LastWhisperFrom = -1;
		m_Show = false;
		m_BacklogPage = 0;
		m_CompletionChosen = -1;
		m_CompletionFav = -1;
		m_aCompletionBuffer[0] = '\0';
		m_PlaceholderOffset = 0;
		m_PlaceholderLength = 0;
		m_pHistoryEntry = 0x0;
		m_PendingChatCounter = 0;
		m_LastChatSend = 0;

		m_IgnoreCommand = false;
		m_SelectedCommand = 0;
		m_CommandStart = 0;

		m_aFilter.set_size(8); //Should help decrease allocations
		for(int i = 0; i < m_aFilter.size(); i++)
			m_aFilter[i] = false;

		m_FilteredCount = 0;

		for(int i = 0; i < CHAT_NUM; ++i)
			m_aLastSoundPlayed[i] = 0;
	}
	else
	{
		for(int i = 0; i < MAX_LINES; i++)
		{
			m_aLines[i].m_Size.y = -1.0f;
		}
	}

	m_CurrentLineWidth = -1.0f;

	// init chat commands (must be in alphabetical order)
	if(Client()->State() < IClient::STATE_ONLINE)
	{
		m_CommandManager.ClearCommands();
		m_CommandManager.AddCommand("all", "Switch to all chat", "?r[message]", &Com_All, this);
		m_CommandManager.AddCommand("friend", "Add player as friend", "s[name]", &Com_Befriend, this);
		m_CommandManager.AddCommand("m", "Mute a player", "s[name]", &Com_Mute, this);
		m_CommandManager.AddCommand("mute", "Mute a player", "s[name]", &Com_Mute, this);
		m_CommandManager.AddCommand("r", "Reply to a whisper", "?r[message]", &Com_Reply, this);
		m_CommandManager.AddCommand("team", "Switch to team chat", "?r[message]", &Com_Team, this);
		m_CommandManager.AddCommand("w", "Whisper another player", "r[name]", &Com_Whisper, this);
		m_CommandManager.AddCommand("whisper", "Whisper another player", "r[name]", &Com_Whisper, this);
	}
}